

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

Float pbrt::BeamDiffusionMS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  float fVar1;
  float v;
  float fVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  Float FVar5;
  Float FVar6;
  Float v_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  float in_XMM1_Da;
  float in_XMM2_Da;
  Float in_XMM3_Da;
  float in_XMM4_Da;
  Float kappa;
  Float E;
  Float EDn;
  Float phiD;
  Float dv;
  Float dr;
  Float zv;
  Float zr;
  int i;
  Float cE;
  Float cPhi;
  Float ze;
  Float fm2;
  Float fm1;
  Float sigma_tr;
  Float D_g;
  Float rhop;
  Float sigmap_t;
  Float sigmap_s;
  Float Ed;
  int nSamples;
  undefined4 local_48;
  undefined4 local_1c;
  
  local_1c = 0.0;
  fVar2 = in_XMM0_Da * (1.0 - in_XMM2_Da);
  fVar1 = in_XMM1_Da + fVar2;
  fVar3 = (in_XMM1_Da * 2.0 + fVar2) / (fVar1 * 3.0 * fVar1);
  fVar4 = SafeSqrt(0.0);
  FVar5 = FresnelMoment1(in_XMM3_Da);
  FVar6 = FresnelMoment2(in_XMM3_Da);
  for (local_48 = 0; local_48 < 100; local_48 = local_48 + 1) {
    v_00 = SampleExponential(0.0,1.636759e-38);
    v = -v_00 + ((fVar3 * -2.0 * (FVar6 * 3.0 + 1.0)) / (1.0 - FVar5 * 2.0)) * 2.0;
    fVar7 = Sqr<float>(in_XMM4_Da);
    fVar8 = Sqr<float>(v_00);
    dVar13 = std::sqrt((double)(ulong)(uint)(fVar7 + fVar8));
    fVar8 = Sqr<float>(in_XMM4_Da);
    fVar9 = Sqr<float>(v);
    dVar14 = std::sqrt((double)(ulong)(uint)(fVar8 + fVar9));
    fVar9 = 0.07957747 / fVar3;
    fVar8 = FastExp(fVar9);
    fVar10 = FastExp(fVar9);
    fVar8 = fVar9 * (fVar8 / SUB84(dVar13,0) - fVar10 / SUB84(dVar14,0));
    fVar10 = FastExp(fVar9);
    fVar11 = Pow<3>(fVar7);
    fVar12 = FastExp(fVar9);
    fVar7 = Pow<3>(fVar7);
    fVar9 = FastExp(fVar9);
    local_1c = (1.0 - fVar9) * (fVar2 / fVar1) * (fVar2 / fVar1) *
               (fVar8 * (1.0 - FVar5 * 2.0) * 0.25 +
               ((v_00 * (fVar4 * SUB84(dVar13,0) + 1.0) * fVar10) / fVar11 -
               (v * (fVar4 * SUB84(dVar14,0) + 1.0) * fVar12) / fVar7) * 0.07957747 *
               (1.0 - FVar6 * 3.0) * 0.5) + local_1c;
  }
  return local_1c / 100.0;
}

Assistant:

Float BeamDiffusionMS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    const int nSamples = 100;
    Float Ed = 0;
    // Precompute information for dipole integrand
    // Compute reduced scattering coefficients $\sigmaps, \sigmapt$ and albedo $\rhop$
    Float sigmap_s = sigma_s * (1 - g);
    Float sigmap_t = sigma_a + sigmap_s;
    Float rhop = sigmap_s / sigmap_t;

    // Compute non-classical diffusion coefficient $D_\roman{G}$ using Equation
    // $(\ref{eq:diffusion-coefficient-grosjean})$
    Float D_g = (2 * sigma_a + sigmap_s) / (3 * sigmap_t * sigmap_t);

    // Compute effective transport coefficient $\sigmatr$ based on $D_\roman{G}$
    Float sigma_tr = SafeSqrt(sigma_a / D_g);

    // Determine linear extrapolation distance $\depthextrapolation$ using Equation
    // $(\ref{eq:dipole-boundary-condition})$
    Float fm1 = FresnelMoment1(eta), fm2 = FresnelMoment2(eta);
    Float ze = -2 * D_g * (1 + 3 * fm2) / (1 - 2 * fm1);

    // Determine exitance scale factors using Equations $(\ref{eq:kp-exitance-phi})$ and
    // $(\ref{eq:kp-exitance-e})$
    Float cPhi = 0.25f * (1 - 2 * fm1), cE = 0.5f * (1 - 3 * fm2);

    for (int i = 0; i < nSamples; ++i) {
        // Sample real point source depth $\depthreal$
        Float zr = SampleExponential((i + 0.5f) / nSamples, sigmap_t);

        // Evaluate dipole integrand $E_{\roman{d}}$ at $\depthreal$ and add to _Ed_
        Float zv = -zr + 2 * ze;
        Float dr = std::sqrt(Sqr(r) + Sqr(zr)), dv = std::sqrt(Sqr(r) + Sqr(zv));
        // Compute dipole fluence rate $\dipole(r)$ using Equation
        // $(\ref{eq:diffusion-dipole})$
        Float phiD =
            Inv4Pi / D_g * (FastExp(-sigma_tr * dr) / dr - FastExp(-sigma_tr * dv) / dv);

        // Compute dipole vector irradiance $-\N{}\cdot\dipoleE(r)$ using Equation
        // $(\ref{eq:diffusion-dipole-vector-irradiance-normal})$
        Float EDn =
            Inv4Pi * (zr * (1 + sigma_tr * dr) * FastExp(-sigma_tr * dr) / (Pow<3>(dr)) -
                      zv * (1 + sigma_tr * dv) * FastExp(-sigma_tr * dv) / (Pow<3>(dv)));

        // Add contribution from dipole for depth $\depthreal$ to _Ed_
        Float E = phiD * cPhi + EDn * cE;
        Float kappa = 1 - FastExp(-2 * sigmap_t * (dr + zr));
        Ed += kappa * rhop * rhop * E;
    }
    return Ed / nSamples;
}